

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O0

agent_queue_t * __thiscall
so_5::disp::thread_pool::impl::work_thread_details::
work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
::pop_agent_queue(work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
                  *this)

{
  mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t> *this_00;
  type condition;
  agent_queue_t *paVar1;
  agent_queue_t *result;
  work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>
  *this_local;
  
  no_activity_tracking_impl_t::wait_started((no_activity_tracking_impl_t *)this);
  this_00 = *(mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t> **)this;
  condition = std::
              unique_ptr<so_5::disp::mpmc_queue_traits::condition_t,_std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>_>
              ::operator*((unique_ptr<so_5::disp::mpmc_queue_traits::condition_t,_std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>_>
                           *)(this + 0x18));
  paVar1 = reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>::pop
                     (this_00,condition);
  no_activity_tracking_impl_t::wait_finished((no_activity_tracking_impl_t *)this);
  return paVar1;
}

Assistant:

agent_queue_t *
		pop_agent_queue() SO_5_NOEXCEPT
			{
				agent_queue_t * result = nullptr;

				this->wait_started();

				result = this->m_disp_queue->pop( *(this->m_condition) );

				this->wait_finished();

				return result;
			}